

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaeValidator.cpp
# Opt level: O3

int __thiscall opencollada::DaeValidator::checkUniqueSids(DaeValidator *this,Dae *dae)

{
  bool bVar1;
  XmlNodeSet *pXVar2;
  size_t sVar3;
  iterator iVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  int iVar7;
  iterator iVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  sids;
  XmlNode child;
  string sid;
  XmlNode parent;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 *local_e0;
  undefined8 local_d8;
  Dae *local_d0;
  XmlNode local_c8;
  undefined1 local_c0 [32];
  XmlAttribute local_a0;
  XmlNode local_98;
  string local_90;
  iterator local_70;
  iterator local_60;
  iterator local_50;
  iterator local_40;
  
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"Checking unique sids...",0x17);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + 'P');
  ::std::ostream::put('P');
  ::std::ostream::flush();
  local_d0 = dae;
  local_c0._0_8_ = XmlDoc::root(&dae->super_XmlDoc);
  local_100._0_8_ = &local_f0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"//*[@sid]/..","");
  pXVar2 = XmlNode::selectNodes((XmlNode *)local_c0,(string *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ != &local_f0) {
    operator_delete((void *)local_100._0_8_);
  }
  iVar8 = XmlNodeSet::begin(pXVar2);
  local_50.mNodeSet = iVar8.mNodeSet;
  local_50.mIndex = iVar8.mIndex;
  iVar8 = XmlNodeSet::end(pXVar2);
  local_40.mNodeSet = iVar8.mNodeSet;
  local_40.mIndex = iVar8.mIndex;
  bVar1 = XmlNodeSet::iterator::operator!=(&local_50,&local_40);
  iVar7 = 0;
  if (bVar1) {
    local_d0 = (Dae *)&local_d0->mUri;
    iVar7 = 0;
    do {
      local_98 = XmlNodeSet::iterator::operator*(&local_50);
      local_100._0_8_ = &local_f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"*[@sid]","");
      pXVar2 = XmlNode::selectNodes(&local_98,(string *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != &local_f0) {
        operator_delete((void *)local_100._0_8_);
      }
      local_100._8_4_ = 0;
      local_f0._M_allocated_capacity = 0;
      local_f0._8_8_ = local_100 + 8;
      local_d8 = 0;
      local_e0 = (undefined1 *)local_f0._8_8_;
      iVar8 = XmlNodeSet::begin(pXVar2);
      local_60.mNodeSet = iVar8.mNodeSet;
      local_60.mIndex = iVar8.mIndex;
      iVar8 = XmlNodeSet::end(pXVar2);
      local_70.mNodeSet = iVar8.mNodeSet;
      local_70.mIndex = iVar8.mIndex;
      while( true ) {
        bVar1 = XmlNodeSet::iterator::operator!=(&local_60,&local_70);
        if (!bVar1) break;
        local_c8 = XmlNodeSet::iterator::operator*(&local_60);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sid","");
        local_a0 = XmlNode::attribute(&local_c8,&local_90);
        XmlAttribute::value_abi_cxx11_((string *)local_c0,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        sVar3 = XmlNode::line(&local_c8);
        iVar4 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *)local_100,(string *)local_c0);
        if (iVar4._M_node == (_Base_ptr)(local_100 + 8)) {
          pmVar6 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                 *)local_100,(string *)local_c0);
          *pmVar6 = sVar3;
        }
        else {
          poVar5 = operator<<((ostream *)&::std::cerr,(Uri *)local_d0);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
          poVar5 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,": Duplicated sid \"",0x12);
          poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_c0._0_8_,local_c0._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\". See first declaration at line ",0x21);
          poVar5 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
          ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          ::std::ostream::put((char)poVar5);
          iVar7 = 1;
          ::std::ostream::flush();
        }
        if ((xmlNodePtr)local_c0._0_8_ != (xmlNodePtr)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_);
        }
        XmlNodeSet::iterator::operator++(&local_60);
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)local_100);
      XmlNodeSet::iterator::operator++(&local_50);
      bVar1 = XmlNodeSet::iterator::operator!=(&local_50,&local_40);
    } while (bVar1);
  }
  return iVar7;
}

Assistant:

int DaeValidator::checkUniqueSids(const Dae & dae) const
	{
		cout << "Checking unique sids..." << endl;

		int result = 0;
		const auto & parents = dae.root().selectNodes("//*[@sid]/..");
		for (auto parent : parents)
		{
			const auto & children = parent.selectNodes("*[@sid]");
			map<string, size_t> sids;
			for (auto child : children)
			{
				string sid = child.attribute("sid").value();
				size_t line = child.line();

				auto it = sids.find(sid);
				if (it != sids.end())
				{
					cerr << dae.getURI() << ":" << line << ": Duplicated sid \"" << sid << "\". See first declaration at line " << it->second << "." << endl;
					result |= 1;
				}
				else
				{
					sids[sid] = line;
				}
			}
		}
		return result;
	}